

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vi.c
# Opt level: O3

el_action_t vi_change_case(EditLine *el,wint_t c)

{
  int iVar1;
  wchar_t wVar2;
  wchar_t *pwVar3;
  wchar_t wVar4;
  
  wVar4 = L'\x06';
  if ((el->el_line).cursor < (el->el_line).lastchar) {
    cv_undo(el);
    wVar4 = L'\0';
    if (L'\0' < (el->el_state).argument) {
      do {
        wVar2 = *(el->el_line).cursor;
        iVar1 = iswupper(wVar2);
        if (iVar1 == 0) {
          iVar1 = iswlower(wVar2);
          if (iVar1 != 0) {
            wVar2 = towupper(wVar2);
            goto LAB_00114081;
          }
          pwVar3 = (el->el_line).cursor;
        }
        else {
          wVar2 = towlower(wVar2);
LAB_00114081:
          pwVar3 = (el->el_line).cursor;
          *pwVar3 = wVar2;
        }
        (el->el_line).cursor = pwVar3 + 1;
        if ((el->el_line).lastchar <= pwVar3 + 1) {
          (el->el_line).cursor = pwVar3;
          re_fastaddc(el);
          break;
        }
        re_fastaddc(el);
        wVar4 = wVar4 + L'\x01';
      } while (wVar4 < (el->el_state).argument);
      wVar4 = L'\0';
    }
  }
  return (el_action_t)wVar4;
}

Assistant:

libedit_private el_action_t
vi_change_case(EditLine *el, wint_t c)
{
	int i;

	if (el->el_line.cursor >= el->el_line.lastchar)
		return CC_ERROR;
	cv_undo(el);
	for (i = 0; i < el->el_state.argument; i++) {

		c = *el->el_line.cursor;
		if (iswupper(c))
			*el->el_line.cursor = towlower(c);
		else if (iswlower(c))
			*el->el_line.cursor = towupper(c);

		if (++el->el_line.cursor >= el->el_line.lastchar) {
			el->el_line.cursor--;
			re_fastaddc(el);
			break;
		}
		re_fastaddc(el);
	}
	return CC_NORM;
}